

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O1

bool __thiscall MT32Emu::Poly::startDecay(Poly *this)

{
  PolyState PVar1;
  int t;
  long lVar2;
  
  PVar1 = this->state;
  if ((PVar1 & ~POLY_Held) != POLY_Releasing) {
    if (PVar1 != POLY_Releasing) {
      this->state = POLY_Releasing;
      (*this->part->_vptr_Part[10])(this->part,(ulong)PVar1,2);
    }
    lVar2 = 0;
    do {
      if (this->partials[lVar2] != (Partial *)0x0) {
        Partial::startDecayAll(this->partials[lVar2]);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  return (PVar1 & ~POLY_Held) != POLY_Releasing;
}

Assistant:

bool Poly::startDecay() {
	if (state == POLY_Inactive || state == POLY_Releasing) {
		return false;
	}
	setState(POLY_Releasing);

	for (int t = 0; t < 4; t++) {
		Partial *partial = partials[t];
		if (partial != NULL) {
			partial->startDecayAll();
		}
	}
	return true;
}